

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O1

int aom_copy_metadata_to_frame_buffer(YV12_BUFFER_CONFIG *ybf,aom_metadata_array_t *arr)

{
  aom_metadata_array_t *paVar1;
  aom_metadata_t *paVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar3 = -1;
  if ((arr != (aom_metadata_array_t *)0x0 && ybf != (YV12_BUFFER_CONFIG *)0x0) &&
     (arr->metadata_array != (aom_metadata_t **)0x0)) {
    paVar1 = ybf->metadata;
    if (paVar1 != arr) {
      if (paVar1 != (aom_metadata_array_t *)0x0) {
        aom_img_metadata_array_free(paVar1);
        ybf->metadata = (aom_metadata_array_t *)0x0;
      }
      paVar1 = aom_img_metadata_array_alloc(arr->sz);
      ybf->metadata = paVar1;
      if (paVar1 == (aom_metadata_array_t *)0x0) {
        return -1;
      }
      bVar5 = ybf->metadata->sz != 0;
      if (bVar5) {
        uVar4 = 0;
        do {
          paVar2 = arr->metadata_array[uVar4];
          paVar2 = aom_img_metadata_alloc
                             (paVar2->type,paVar2->payload,paVar2->sz,paVar2->insert_flag);
          ybf->metadata->metadata_array[uVar4] = paVar2;
          if (ybf->metadata->metadata_array[uVar4] == (aom_metadata_t *)0x0) {
            aom_img_metadata_array_free(ybf->metadata);
            ybf->metadata = (aom_metadata_array_t *)0x0;
            if (bVar5) {
              return -1;
            }
            break;
          }
          uVar4 = uVar4 + 1;
          bVar5 = uVar4 < ybf->metadata->sz;
        } while (bVar5);
      }
      ybf->metadata->sz = arr->sz;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int aom_copy_metadata_to_frame_buffer(YV12_BUFFER_CONFIG *ybf,
                                      const aom_metadata_array_t *arr) {
  if (!ybf || !arr || !arr->metadata_array) return -1;
  if (ybf->metadata == arr) return 0;
  aom_remove_metadata_from_frame_buffer(ybf);
  ybf->metadata = aom_img_metadata_array_alloc(arr->sz);
  if (!ybf->metadata) return -1;
  for (size_t i = 0; i < ybf->metadata->sz; i++) {
    ybf->metadata->metadata_array[i] = aom_img_metadata_alloc(
        arr->metadata_array[i]->type, arr->metadata_array[i]->payload,
        arr->metadata_array[i]->sz, arr->metadata_array[i]->insert_flag);
    if (ybf->metadata->metadata_array[i] == NULL) {
      aom_img_metadata_array_free(ybf->metadata);
      ybf->metadata = NULL;
      return -1;
    }
  }
  ybf->metadata->sz = arr->sz;
  return 0;
}